

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall wasm::PrintSExpression::visitIf(PrintSExpression *this,If *curr)

{
  ostream *poVar1;
  char *pcVar2;
  size_t sVar3;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  this->controlFlowDepth = this->controlFlowDepth + 1;
  local_50 = (long *)CONCAT71(local_50._1_7_,0x28);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
  printExpressionContents(this,(Expression *)curr);
  incIndent(this);
  printFullLine(this,curr->condition);
  poVar1 = this->o;
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)this->indent);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,local_48);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->o,"(then",5);
  incIndent(this);
  maybePrintImplicitBlock(this,curr->ifTrue);
  decIndent(this);
  poVar1 = this->o;
  pcVar2 = this->maybeNewLine;
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,sVar3);
  }
  if (curr->ifFalse != (Expression *)0x0) {
    poVar1 = this->o;
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)this->indent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->o,"(else",5);
    incIndent(this);
    printDebugDelimiterLocation(this,(Expression *)curr,0);
    maybePrintImplicitBlock(this,curr->ifFalse);
    decIndent(this);
    poVar1 = this->o;
    pcVar2 = this->maybeNewLine;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,sVar3);
    }
  }
  decIndent(this);
  if (this->full == true) {
    std::__ostream_insert<char,std::char_traits<char>>(this->o," ;; end if",10);
  }
  this->controlFlowDepth = this->controlFlowDepth + -1;
  return;
}

Assistant:

void PrintSExpression::visitIf(If* curr) {
  controlFlowDepth++;
  o << '(';
  printExpressionContents(curr);
  incIndent();
  printFullLine(curr->condition);
  doIndent(o, indent);
  o << "(then";
  incIndent();
  maybePrintImplicitBlock(curr->ifTrue);
  decIndent();
  o << maybeNewLine;
  if (curr->ifFalse) {
    doIndent(o, indent);
    o << "(else";
    incIndent();
    // Note: debug info here is not used as LLVM does not emit ifs, and since
    // LLVM is the main source of DWARF, effectively we never encounter ifs
    // with DWARF.
    printDebugDelimiterLocation(curr, BinaryLocations::Else);
    maybePrintImplicitBlock(curr->ifFalse);
    decIndent();
    o << maybeNewLine;
  }
  decIndent();
  if (full) {
    o << " ;; end if";
  }
  controlFlowDepth--;
}